

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::MinSampleShadingValueClampingCase::iterate
          (MinSampleShadingValueClampingCase *this)

{
  ostringstream *this_00;
  TestLog *log;
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_1f9;
  CallLogWrapper gl;
  ResultCollector result;
  undefined1 local_190 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_190," // ERROR: ",&local_1f9);
  tcu::ResultCollector::ResultCollector(&result,log,(string *)local_190);
  std::__cxx11::string::~string((string *)local_190);
  gl.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_190._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Verifying clamped values. Value is clamped when specified.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  glu::CallLogWrapper::glMinSampleShading(&gl,-0.5);
  deqp::gls::StateQueryUtil::verifyStateFloat(&result,&gl,0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&gl,-1.0);
  deqp::gls::StateQueryUtil::verifyStateFloat(&result,&gl,0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&gl,-1.5);
  deqp::gls::StateQueryUtil::verifyStateFloat(&result,&gl,0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&gl,1.5);
  deqp::gls::StateQueryUtil::verifyStateFloat(&result,&gl,0x8c37,1.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&gl,2.0);
  deqp::gls::StateQueryUtil::verifyStateFloat(&result,&gl,0x8c37,1.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&gl,2.5);
  deqp::gls::StateQueryUtil::verifyStateFloat(&result,&gl,0x8c37,1.0,QUERY_FLOAT);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

MinSampleShadingValueClampingCase::IterateResult MinSampleShadingValueClampingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// special values
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying clamped values. Value is clamped when specified." << tcu::TestLog::EndMessage;

		gl.glMinSampleShading(-0.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(-1.0f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(-1.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(1.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);

		gl.glMinSampleShading(2.0f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);

		gl.glMinSampleShading(2.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}